

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                 (UnknownFieldSet *unknown_fields)

{
  int iVar1;
  Type TVar2;
  int iVar3;
  uint32_t uVar4;
  uint64_t value;
  size_type sVar5;
  size_t sVar6;
  UnknownFieldSet *unknown_fields_00;
  string_view local_48;
  string_view local_38;
  UnknownField *local_28;
  UnknownField *field;
  size_t sStack_18;
  int i;
  size_t size;
  UnknownFieldSet *unknown_fields_local;
  
  sStack_18 = 0;
  size = (size_t)unknown_fields;
  for (field._4_4_ = 0; iVar3 = field._4_4_,
      iVar1 = UnknownFieldSet::field_count((UnknownFieldSet *)size), iVar3 < iVar1;
      field._4_4_ = field._4_4_ + 1) {
    local_28 = UnknownFieldSet::field((UnknownFieldSet *)size,field._4_4_);
    TVar2 = UnknownField::type(local_28);
    switch(TVar2) {
    case TYPE_VARINT:
      iVar3 = UnknownField::number(local_28);
      uVar4 = WireFormatLite::MakeTag(iVar3,WIRETYPE_VARINT);
      sVar6 = io::CodedOutputStream::VarintSize32(uVar4);
      sStack_18 = sVar6 + sStack_18;
      value = UnknownField::varint(local_28);
      sVar6 = io::CodedOutputStream::VarintSize64(value);
      sStack_18 = sVar6 + sStack_18;
      break;
    case TYPE_FIXED32:
      iVar3 = UnknownField::number(local_28);
      uVar4 = WireFormatLite::MakeTag(iVar3,WIRETYPE_FIXED32);
      sVar6 = io::CodedOutputStream::VarintSize32(uVar4);
      sStack_18 = sVar6 + sStack_18 + 4;
      break;
    case TYPE_FIXED64:
      iVar3 = UnknownField::number(local_28);
      uVar4 = WireFormatLite::MakeTag(iVar3,WIRETYPE_FIXED64);
      sVar6 = io::CodedOutputStream::VarintSize32(uVar4);
      sStack_18 = sVar6 + sStack_18 + 8;
      break;
    case TYPE_LENGTH_DELIMITED:
      iVar3 = UnknownField::number(local_28);
      uVar4 = WireFormatLite::MakeTag(iVar3,WIRETYPE_LENGTH_DELIMITED);
      sVar6 = io::CodedOutputStream::VarintSize32(uVar4);
      sStack_18 = sVar6 + sStack_18;
      local_38 = UnknownField::length_delimited(local_28);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_38);
      sVar6 = io::CodedOutputStream::VarintSize32((uint32_t)sVar5);
      sStack_18 = sVar6 + sStack_18;
      local_48 = UnknownField::length_delimited(local_28);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_48);
      sStack_18 = sVar5 + sStack_18;
      break;
    case TYPE_GROUP:
      iVar3 = UnknownField::number(local_28);
      uVar4 = WireFormatLite::MakeTag(iVar3,WIRETYPE_START_GROUP);
      sVar6 = io::CodedOutputStream::VarintSize32(uVar4);
      sStack_18 = sVar6 + sStack_18;
      unknown_fields_00 = UnknownField::group(local_28);
      sVar6 = ComputeUnknownFieldsSize(unknown_fields_00);
      sStack_18 = sVar6 + sStack_18;
      iVar3 = UnknownField::number(local_28);
      uVar4 = WireFormatLite::MakeTag(iVar3,WIRETYPE_END_GROUP);
      sVar6 = io::CodedOutputStream::VarintSize32(uVar4);
      sStack_18 = sVar6 + sStack_18;
    }
  }
  return sStack_18;
}

Assistant:

size_t WireFormat::ComputeUnknownFieldsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_VARINT));
        size += io::CodedOutputStream::VarintSize64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED32));
        size += sizeof(int32_t);
        break;
      case UnknownField::TYPE_FIXED64:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED64));
        size += sizeof(int64_t);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        size += io::CodedOutputStream::VarintSize32(
            field.length_delimited().size());
        size += field.length_delimited().size();
        break;
      case UnknownField::TYPE_GROUP:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP));
        size += ComputeUnknownFieldsSize(field.group());
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }

  return size;
}